

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModelHelpers.c
# Opt level: O0

JL_STATUS JlAddStringToDictionaryObject(JlDataObject *DictionaryObject,char *KeyName,char *String)

{
  JlDataObject *local_30;
  JlDataObject *stringObject;
  char *pcStack_20;
  JL_STATUS jlStatus;
  char *String_local;
  char *KeyName_local;
  JlDataObject *DictionaryObject_local;
  
  local_30 = (JlDataObject *)0x0;
  if ((DictionaryObject == (JlDataObject *)0x0) || (KeyName == (char *)0x0)) {
    stringObject._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    pcStack_20 = String;
    String_local = KeyName;
    KeyName_local = (char *)DictionaryObject;
    stringObject._4_4_ = JlCreateStringObject(String,&local_30);
    if ((stringObject._4_4_ == JL_STATUS_SUCCESS) &&
       (stringObject._4_4_ =
             JlAttachObjectToDictionaryObject((JlDataObject *)KeyName_local,String_local,local_30),
       stringObject._4_4_ != JL_STATUS_SUCCESS)) {
      JlFreeObjectTree(&local_30);
    }
  }
  return stringObject._4_4_;
}

Assistant:

JL_STATUS
    JlAddStringToDictionaryObject
    (
        JlDataObject*       DictionaryObject,   // [in,out]
        char const*         KeyName,            // [in]
        char const*         String              // [in]
    )
{
    JL_STATUS jlStatus;
    JlDataObject* stringObject = NULL;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName )
    {
        jlStatus = JlCreateStringObject( String, &stringObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlAttachObjectToDictionaryObject( DictionaryObject, KeyName, stringObject );
            if( JL_STATUS_SUCCESS != jlStatus )
            {
                (void) JlFreeObjectTree( &stringObject );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}